

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O3

BOOL Silent_ExtractFormatA
               (LPCSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,LPINT Precision,LPINT Prefix,
               LPINT Type)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  byte bVar4;
  byte *pbVar5;
  BOOL BVar6;
  uint uVar7;
  char *pcVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pcVar3 = *Fmt;
  if (pcVar3 == (char *)0x0) {
    return 0;
  }
  if (*pcVar3 != '%') {
    return 0;
  }
  *Fmt = pcVar3 + 1;
  *Out = *pcVar3;
  sVar2 = strlen(*Fmt);
  pcVar3 = (char *)PAL_malloc(sVar2 + 1);
  if (pcVar3 == (char *)0x0) {
    return 0;
  }
  do {
    pbVar10 = (byte *)Out + 1;
    pbVar9 = (byte *)*Fmt;
    bVar4 = *pbVar9;
    if (bVar4 < 0x2b) {
      if (bVar4 == 0x20) {
        uVar7 = 8;
      }
      else {
        if (bVar4 != 0x23) break;
        uVar7 = 2;
      }
    }
    else if (bVar4 == 0x30) {
      uVar7 = 4;
    }
    else {
      uVar7 = 1;
      if (bVar4 != 0x2d) {
        if (bVar4 != 0x2b) break;
        uVar7 = 0x10;
      }
    }
    *Flags = *Flags | uVar7;
    *Fmt = (LPCSTR)(pbVar9 + 1);
    *pbVar10 = *pbVar9;
    Out = (LPSTR)pbVar10;
  } while( true );
  if ((~*Flags & 5U) == 0) {
    *Flags = *Flags - 4;
    bVar4 = *pbVar9;
  }
  iVar1 = isdigit((uint)bVar4);
  pbVar9 = (byte *)*Fmt;
  if (iVar1 == 0) {
    if (*pbVar9 == 0x2a) {
      *Width = -2;
      *Fmt = (LPCSTR)(pbVar9 + 1);
      *pbVar10 = *pbVar9;
      pbVar10 = (byte *)Out + 2;
      iVar1 = isdigit((uint)(byte)**Fmt);
      if (iVar1 != 0) {
        *Width = -3;
        while (iVar1 = isdigit((uint)(byte)**Fmt), iVar1 != 0) {
          pbVar9 = (byte *)*Fmt;
          *Fmt = (LPCSTR)(pbVar9 + 1);
          *pbVar10 = *pbVar9;
          pbVar10 = pbVar10 + 1;
        }
      }
    }
  }
  else {
    iVar1 = isdigit((uint)*pbVar9);
    pcVar8 = pcVar3;
    while (iVar1 != 0) {
      *pcVar8 = **Fmt;
      pcVar8 = pcVar8 + 1;
      pbVar9 = (byte *)*Fmt;
      *Fmt = (LPCSTR)(pbVar9 + 1);
      *pbVar10 = *pbVar9;
      pbVar10 = pbVar10 + 1;
      iVar1 = isdigit((uint)(byte)**Fmt);
    }
    *pcVar8 = '\0';
    iVar1 = atoi(pcVar3);
    *Width = iVar1;
    if (iVar1 < 0) goto LAB_00319b87;
  }
  pbVar5 = (byte *)*Fmt;
  pbVar9 = pbVar10;
  if (*pbVar5 == 0x2e) {
    *Fmt = (LPCSTR)(pbVar5 + 1);
    pbVar9 = pbVar10 + 1;
    *pbVar10 = *pbVar5;
    iVar1 = isdigit((uint)(byte)**Fmt);
    pbVar5 = (byte *)*Fmt;
    if (iVar1 == 0) {
      if (*pbVar5 == 0x2a) {
        *Precision = -2;
        *Fmt = (LPCSTR)(pbVar5 + 1);
        pbVar10[1] = *pbVar5;
        pbVar9 = pbVar10 + 2;
        iVar1 = isdigit((uint)(byte)**Fmt);
        if (iVar1 != 0) {
          *Precision = -4;
          while (iVar1 = isdigit((uint)(byte)**Fmt), iVar1 != 0) {
            pbVar10 = (byte *)*Fmt;
            *Fmt = (LPCSTR)(pbVar10 + 1);
            *pbVar9 = *pbVar10;
            pbVar9 = pbVar9 + 1;
          }
        }
      }
      else {
        *Precision = -3;
      }
    }
    else {
      iVar1 = isdigit((uint)*pbVar5);
      pcVar8 = pcVar3;
      while (iVar1 != 0) {
        *pcVar8 = **Fmt;
        pcVar8 = pcVar8 + 1;
        pbVar10 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar10 + 1);
        *pbVar9 = *pbVar10;
        pbVar9 = pbVar9 + 1;
        iVar1 = isdigit((uint)(byte)**Fmt);
      }
      *pcVar8 = '\0';
      iVar1 = atoi(pcVar3);
      *Precision = iVar1;
      if (iVar1 < 0) {
LAB_00319b87:
        SetLastError(0x54f);
        return 0;
      }
    }
  }
  pbVar10 = (byte *)*Fmt;
  bVar4 = *pbVar10;
  if (bVar4 == 0x70) {
    *Prefix = 3;
    bVar4 = *pbVar10;
  }
  pbVar5 = pbVar10;
  if (bVar4 < 0x68) {
    if (bVar4 == 0x49) {
      if ((pbVar10[1] == 0x36) && (pbVar10[2] == 0x34)) {
        pbVar5 = pbVar10 + 3;
        *Fmt = (LPCSTR)pbVar5;
        *Prefix = 3;
      }
    }
    else if (bVar4 == 0x4c) {
      *Fmt = (LPCSTR)(pbVar10 + 1);
      pbVar5 = pbVar10 + 1;
    }
LAB_00319c3b:
    bVar4 = *pbVar5;
  }
  else {
    if (bVar4 == 0x68) {
      *Prefix = 1;
      *Fmt = (LPCSTR)(pbVar10 + 1);
      pbVar5 = pbVar10 + 1;
      goto LAB_00319c3b;
    }
    if ((bVar4 != 0x6c) && (bVar4 != 0x77)) goto LAB_00319c3b;
    pbVar5 = pbVar10 + 1;
    *Fmt = (LPCSTR)pbVar5;
    bVar4 = pbVar10[1];
    if ((bVar4 | 0x10) == 0x73) {
      *Prefix = 2;
      goto LAB_00319c3b;
    }
  }
  BVar6 = 0;
  if (bVar4 < 0x53) {
    if (bVar4 != 0x43) {
      if ((bVar4 != 0x45) && (BVar6 = 0, bVar4 != 0x47)) goto switchD_00319c61_caseD_68;
      goto switchD_00319c61_caseD_65;
    }
switchD_00319c61_caseD_63:
    *Type = 1;
    if (*Prefix != 1) {
      if (*pbVar5 == 0x43) {
        *Prefix = 2;
      }
      else if (*Prefix != 2) goto LAB_00319da9;
      *pbVar9 = 0x6c;
      pbVar9 = pbVar9 + 1;
    }
LAB_00319da9:
    *pbVar9 = 99;
LAB_00319dcc:
    pbVar9 = pbVar9 + 1;
    *Fmt = *Fmt + 1;
    goto LAB_00319dd2;
  }
  switch(bVar4) {
  case 99:
    goto switchD_00319c61_caseD_63;
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    goto switchD_00319c61_caseD_64;
  case 0x65:
  case 0x66:
  case 0x67:
switchD_00319c61_caseD_65:
    *Type = 7;
    goto LAB_00319d2d;
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_00319c61_caseD_68;
  case 0x6e:
    if (*Prefix == 1) {
      *pbVar9 = 0x68;
      pbVar9 = pbVar9 + 1;
      pbVar5 = (byte *)*Fmt;
    }
    *Fmt = (LPCSTR)(pbVar5 + 1);
    *pbVar9 = *pbVar5;
    pbVar9 = pbVar9 + 1;
    *Type = 6;
    goto LAB_00319dd2;
  case 0x70:
    *Type = 5;
    *Fmt = (LPCSTR)(pbVar5 + 1);
    *pbVar9 = *pbVar5;
    pbVar9 = pbVar9 + 1;
    BVar6 = 1;
    if (*Prefix == 3) {
      if (*Precision == -1) {
        *Precision = 0x10;
      }
    }
    else if (*Precision == -1) {
      *Precision = 8;
    }
    goto switchD_00319c61_caseD_68;
  case 0x73:
switchD_00319c61_caseD_73:
    *Type = 2;
    if (*Prefix != 1) {
      if (*pbVar5 == 0x53) {
        *Prefix = 2;
      }
      else if (*Prefix != 2) goto LAB_00319dc8;
      *pbVar9 = 0x6c;
      pbVar9 = pbVar9 + 1;
    }
LAB_00319dc8:
    *pbVar9 = 0x73;
    goto LAB_00319dcc;
  }
  if (bVar4 == 0x53) goto switchD_00319c61_caseD_73;
  if (bVar4 != 0x58) goto switchD_00319c61_caseD_68;
switchD_00319c61_caseD_64:
  *Type = 4;
  iVar1 = *Prefix;
  if (iVar1 == 3) {
    pbVar9[0] = 0x6c;
    pbVar9[1] = 0x6c;
    pbVar9 = pbVar9 + 2;
  }
  else {
    if (iVar1 == 2) {
      *pbVar9 = 0x6c;
    }
    else {
      if (iVar1 != 1) goto LAB_00319d2a;
      *pbVar9 = 0x68;
    }
    pbVar9 = pbVar9 + 1;
  }
LAB_00319d2a:
  pbVar5 = (byte *)*Fmt;
LAB_00319d2d:
  *Fmt = (LPCSTR)(pbVar5 + 1);
  *pbVar9 = *pbVar5;
  pbVar9 = pbVar9 + 1;
LAB_00319dd2:
  BVar6 = 1;
switchD_00319c61_caseD_68:
  *pbVar9 = 0;
  PAL_free(pcVar3);
  return BVar6;
}

Assistant:

BOOL Silent_ExtractFormatA(LPCSTR *Fmt, LPSTR Out, LPINT Flags, LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) PAL_malloc(strlen(*Fmt)+1);
    if (!TempStr)
    {
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
        case '-':
            *Flags |= PFF_MINUS; break;
        case '+':
            *Flags |= PFF_PLUS; break;
        case '0':
            *Flags |= PFF_ZERO; break;
        case ' ':
            *Flags |= PFF_SPACE; break;
        case '#':
            *Flags |= PFF_POUND; break;
        }
            *Out++ = *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit((unsigned char) **Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit((unsigned char) **Fmt))
        {
            *TempStrPtr++ = **Fmt;
            *Out++ = *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit((unsigned char) **Fmt))
            {
               *Out++ = *(*Fmt)++;
            }
        }
    }


    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit((unsigned char) **Fmt))
            {
                *TempStrPtr++ = **Fmt;
                *Out++ = *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = *(*Fmt)++;
            if (isdigit((unsigned char) **Fmt))
            {
                /* this is an invalid precision because we have a .* then a
                   number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit((unsigned char) **Fmt))
                {
                    *Out++ = *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    /* grab prefix of 'I64' for __int64 */
    if ((*Fmt)[0] == 'I' && (*Fmt)[1] == '6' && (*Fmt)[2] == '4')
    {
        /* convert to 'll' so BSD's snprintf can handle it */
        *Fmt += 3;
        *Prefix = PFF_PREFIX_LONGLONG;
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    /* grab prefix of 'l' or the undocumented 'w' (at least in MSDN) */
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
#ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'c' || **Fmt == 's')
#endif       
        {
            *Prefix = PFF_PREFIX_LONG;
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }

    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'C')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S')
    {
        *Type = PFF_TYPE_STRING;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'S')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        *Out++ = *(*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
            }
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
            }
        }
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    PAL_free(TempStr);
    return Result;
}